

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_file.cpp
# Opt level: O0

void Omega_h::write_reals_txt(ostream *stream,Reals *a,Int ncomps)

{
  _Setprecision _Var1;
  ostream *poVar2;
  double *pdVar3;
  int local_78;
  int local_74;
  Int j;
  LO i;
  Read<double> local_60;
  undefined1 local_50 [8];
  HostRead<double> h_a;
  int n;
  Int ncomps_local;
  Reals *a_local;
  ostream *stream_local;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  h_a.read_.write_.shared_alloc_.direct_ptr._4_4_ = ncomps;
  h_a.read_.write_.shared_alloc_.direct_ptr._0_4_ =
       divide_no_remainder<int>((int)(local_10 >> 3),ncomps);
  Read<double>::Read(&local_60,a);
  HostRead<double>::HostRead((HostRead<double> *)local_50,(Read<signed_char> *)&local_60);
  Read<double>::~Read(&local_60);
  poVar2 = (ostream *)std::ostream::operator<<(stream,std::scientific);
  _Var1 = std::setprecision(0x11);
  std::operator<<(poVar2,_Var1);
  for (local_74 = 0; local_74 < (int)h_a.read_.write_.shared_alloc_.direct_ptr;
      local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < h_a.read_.write_.shared_alloc_.direct_ptr._4_4_;
        local_78 = local_78 + 1) {
      pdVar3 = HostRead<double>::operator[]
                         ((HostRead<double> *)local_50,
                          local_74 * h_a.read_.write_.shared_alloc_.direct_ptr._4_4_ + local_78);
      std::ostream::operator<<(stream,*pdVar3);
      if (local_78 < h_a.read_.write_.shared_alloc_.direct_ptr._4_4_ + -1) {
        std::operator<<(stream,' ');
      }
    }
    std::operator<<(stream,'\n');
  }
  HostRead<double>::~HostRead((HostRead<double> *)local_50);
  return;
}

Assistant:

void write_reals_txt(std::ostream& stream, Reals a, Int ncomps) {
  auto n = divide_no_remainder(a.size(), ncomps);
  auto h_a = HostRead<Real>(a);
  stream << std::scientific << std::setprecision(17);
  for (LO i = 0; i < n; ++i) {
    for (Int j = 0; j < ncomps; ++j) {
      stream << h_a[i * ncomps + j];
      if (j < ncomps - 1) stream << ' ';
    }
    stream << '\n';
  }
}